

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O2

bool __thiscall APowerInvisibility::HandlePickup(APowerInvisibility *this,AInventory *item)

{
  int *piVar1;
  int iVar2;
  bool bVar3;
  PClass *pPVar4;
  PClass *pPVar5;
  APowerup *power;
  
  if (((this->super_APowerup).Mode.super_FName.Index == 0x14) &&
     ((double)(this->super_APowerup).super_AInventory.super_AActor.special1 *
      (this->super_APowerup).Strength < 1.0)) {
    pPVar4 = DObject::GetClass((DObject *)item);
    pPVar5 = DObject::GetClass((DObject *)this);
    if (pPVar4 == pPVar5) {
      iVar2 = *(int *)&item->field_0x4fc;
      if (iVar2 != 0) {
        if (*(int *)&(this->super_APowerup).super_AInventory.field_0x4fc < iVar2) {
          *(int *)&(this->super_APowerup).super_AInventory.field_0x4fc = iVar2;
          (this->super_APowerup).BlendColor.field_0 =
               *(anon_union_4_2_12391d7c_for_PalEntry_0 *)(item + 1);
        }
        piVar1 = &(this->super_APowerup).super_AInventory.super_AActor.special1;
        *piVar1 = *piVar1 + 1;
      }
      *(byte *)&item->ItemFlags = (byte)item->ItemFlags | 4;
      return true;
    }
  }
  bVar3 = APowerup::HandlePickup(&this->super_APowerup,item);
  return bVar3;
}

Assistant:

bool APowerInvisibility::HandlePickup (AInventory *item)
{
	if (Mode == NAME_Cumulative && ((Strength * special1) < 1.) && item->GetClass() == GetClass())
	{
		APowerup *power = static_cast<APowerup *>(item);
		if (power->EffectTics == 0)
		{
			power->ItemFlags |= IF_PICKUPGOOD;
			return true;
		}
		// Only increase the EffectTics, not decrease it.
		// Color also gets transferred only when the new item has an effect.
		if (power->EffectTics > EffectTics)
		{
			EffectTics = power->EffectTics;
			BlendColor = power->BlendColor;
		}
		special1++;	// increases power
		power->ItemFlags |= IF_PICKUPGOOD;
		return true;
	}
	return Super::HandlePickup (item);
}